

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void __thiscall
icu_63::DateFormatSymbols::setShortMonths
          (DateFormatSymbols *this,UnicodeString *shortMonthsArray,int32_t count)

{
  UnicodeString *pUVar1;
  UnicodeString *p;
  long lVar2;
  
  pUVar1 = this->fShortMonths;
  if (pUVar1 != (UnicodeString *)0x0) {
    lVar2 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    p = shortMonthsArray;
    if (lVar2 != 0) {
      lVar2 = lVar2 << 6;
      do {
        icu_63::UnicodeString::~UnicodeString
                  ((UnicodeString *)
                   ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar2));
        lVar2 = lVar2 + -0x40;
      } while (lVar2 != 0);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),p);
  }
  pUVar1 = newUnicodeStringArray((long)count);
  this->fShortMonths = pUVar1;
  uprv_arrayCopy(shortMonthsArray,pUVar1,count);
  this->fShortMonthsCount = count;
  return;
}

Assistant:

void
DateFormatSymbols::setShortMonths(const UnicodeString* shortMonthsArray, int32_t count)
{
    // delete the old list if we own it
    if (fShortMonths)
        delete[] fShortMonths;

    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)
    fShortMonths = newUnicodeStringArray(count);
    uprv_arrayCopy(shortMonthsArray,fShortMonths,  count);
    fShortMonthsCount = count;
}